

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O3

bool __thiscall Environment::hasSymbol(Environment *this,Identifier *ident)

{
  pointer __s2;
  _Hash_node_base *__n;
  int iVar1;
  _Hash_node_base *p_Var2;
  
  p_Var2 = (this->symbols)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    __s2 = (ident->_M_dataplus)._M_p;
    __n = (_Hash_node_base *)ident->_M_string_length;
    do {
      if (p_Var2[3]._M_nxt == __n) {
        if (__n == (_Hash_node_base *)0x0) {
          return true;
        }
        iVar1 = bcmp(p_Var2[2]._M_nxt,__s2,(size_t)__n);
        if (iVar1 == 0) {
          return true;
        }
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return false;
}

Assistant:

bool Environment::hasSymbol(const Identifier& ident) {
    for(auto& it : symbols) {
        if(it.first.name == ident)
            return true;
    }
    return false;
}